

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<ReturnStatementAstNode>_> * __thiscall
Parser::parseReturnStatement
          (optional<std::shared_ptr<ReturnStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  element_type *peVar3;
  byte local_131;
  shared_ptr<ReturnStatementAstNode> local_f8;
  shared_ptr<ReturnStatementAstNode> local_e8;
  undefined4 local_d8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [40];
  undefined1 local_88 [24];
  undefined1 local_70 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  string local_50 [6];
  bool foundExpression;
  undefined1 local_30 [8];
  shared_ptr<Token> returnToken;
  bool error;
  Parser *this_local;
  
  returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Expected a return",
             (allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  expect((Parser *)local_30,(TokenType)this,(bool *)0xa,
         (string *)
         ((long)&returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 7));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  skipWhiteSpace(this);
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._22_1_ = 0;
  std::optional<std::shared_ptr<ExpressionAstNode>_>::optional
            ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_70);
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  TokenBuffer::currentToken((TokenBuffer *)local_88);
  peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_88);
  TVar1 = peVar3->tokenType;
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_88);
  if (TVar1 != SemiColon) {
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._22_1_ = 1;
    parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)(local_b0 + 0x10),this);
    std::optional<std::shared_ptr<ExpressionAstNode>_>::operator=
              ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_70,
               (optional<std::shared_ptr<ExpressionAstNode>_> *)(local_b0 + 0x10));
    std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional
              ((optional<std::shared_ptr<ExpressionAstNode>_> *)(local_b0 + 0x10));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"Expected a semicolon to terminate return statement",&local_d1);
  expect((Parser *)local_b0,(TokenType)this,(bool *)0x10,
         (string *)
         ((long)&returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 7));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  if ((expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._22_1_ & 1) != 0) {
    local_131 = 1;
    if ((returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ &
        1) == 0) {
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_70);
      local_131 = bVar2 ^ 0xff;
    }
    returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
         local_131 & 1;
  }
  if ((returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1
      ) == 0) {
    if ((expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._22_1_ & 1) == 0) {
      std::make_shared<ReturnStatementAstNode,std::shared_ptr<Token>&>
                ((shared_ptr<Token> *)&local_f8);
      std::optional<std::shared_ptr<ReturnStatementAstNode>_>::
      optional<std::shared_ptr<ReturnStatementAstNode>,_true>(__return_storage_ptr__,&local_f8);
      std::shared_ptr<ReturnStatementAstNode>::~shared_ptr(&local_f8);
    }
    else {
      std::optional<std::shared_ptr<ExpressionAstNode>_>::value
                ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_70);
      std::
      make_shared<ReturnStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
                ((shared_ptr<Token> *)&local_e8,(shared_ptr<ExpressionAstNode> *)local_30);
      std::optional<std::shared_ptr<ReturnStatementAstNode>_>::
      optional<std::shared_ptr<ReturnStatementAstNode>,_true>(__return_storage_ptr__,&local_e8);
      std::shared_ptr<ReturnStatementAstNode>::~shared_ptr(&local_e8);
    }
  }
  else {
    std::optional<std::shared_ptr<ReturnStatementAstNode>_>::optional(__return_storage_ptr__);
  }
  local_d8 = 1;
  std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional
            ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_70);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ReturnStatementAstNode>>
Parser::parseReturnStatement() noexcept {
  bool error = false;

  auto returnToken = this->expect(TokenType::Return, error, "Expected a return");

  this->skipWhiteSpace();

  bool foundExpression = false;
  std::optional<std::shared_ptr<ExpressionAstNode>> expression{std::nullopt};

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::SemiColon) {
    foundExpression = true;
    expression = this->parseExpression();
  }

  this->expect(TokenType::SemiColon, error, "Expected a semicolon to terminate return statement");

  if (foundExpression) {
    error = error || !expression;
  }

  if (error) { return std::nullopt; }

  if (foundExpression) {
    return std::make_shared<ReturnStatementAstNode>(returnToken, expression.value());
  }

  return std::make_shared<ReturnStatementAstNode>(returnToken);
}